

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

ssize_t __thiscall Args::write(Args *this,int __fd,void *__buf,size_t __n)

{
  vector<char,_std::allocator<char>_> *pvVar1;
  bool bVar2;
  ulong uVar3;
  path *this_00;
  ostream *poVar4;
  runtime_error *this_01;
  FILE *__s;
  char *__ptr;
  size_type __n_00;
  ssize_t extraout_RAX;
  undefined4 in_register_00000034;
  FILE *file;
  string error;
  vector<char,_std::allocator<char>_> data;
  path local_180;
  path local_158;
  path local_130;
  path local_108;
  string local_e0;
  basic_string_view<char,_std::char_traits<char>_> local_b0;
  path local_a0;
  path local_78;
  string local_50;
  string_view local_30;
  DynamicFormat *local_20;
  DynamicFormat *format;
  Bin *bin_local;
  Args *this_local;
  
  format = (DynamicFormat *)CONCAT44(in_register_00000034,__fd);
  bin_local = (Bin *)this;
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_30,"");
  local_20 = get_format(&this->output_format,local_30,&this->output_file);
  if (((this->keep_hashed & 1U) == 0) &&
     (uVar3 = (**(code **)(*(long *)local_20 + 0x18))(), (uVar3 & 1) == 0)) {
    unhash(this,(Bin *)format);
  }
  bVar2 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::empty
                    (&this->output_file);
  if (bVar2) {
    bVar2 = std::operator==(&this->input_file,"-");
    if (bVar2) {
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
                (&this->output_file,"-");
    }
    else {
      std::filesystem::__cxx11::path::path<std::__cxx11::string,std::filesystem::__cxx11::path>
                (&local_78,&this->input_file,auto_format);
      local_b0 = (basic_string_view<char,_std::char_traits<char>_>)
                 (**(code **)(*(long *)local_20 + 0x10))();
      std::filesystem::__cxx11::path::
      path<std::basic_string_view<char,std::char_traits<char>>,std::filesystem::__cxx11::path>
                (&local_a0,&local_b0,auto_format);
      this_00 = (path *)std::filesystem::__cxx11::path::replace_extension(&local_78);
      std::filesystem::__cxx11::path::generic_string(&local_50,this_00);
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
                (&this->output_file,&local_50);
      std::__cxx11::string::~string((string *)&local_50);
      std::filesystem::__cxx11::path::~path(&local_a0);
      std::filesystem::__cxx11::path::~path(&local_78);
      if ((this->recursive & 1U) != 0) {
        bVar2 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                empty(&this->output_dir);
        if (!bVar2) {
          std::filesystem::__cxx11::path::path<std::__cxx11::string,std::filesystem::__cxx11::path>
                    (&local_130,&this->output_dir,auto_format);
          std::filesystem::__cxx11::path::path<std::__cxx11::string,std::filesystem::__cxx11::path>
                    (&local_180,&this->output_file,auto_format);
          std::filesystem::__cxx11::path::path<std::__cxx11::string,std::filesystem::__cxx11::path>
                    ((path *)&data.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                              field_0x10,&this->input_dir,auto_format);
          std::filesystem::relative(&local_158,&local_180);
          std::filesystem::__cxx11::operator/(&local_108,&local_130,&local_158);
          std::filesystem::__cxx11::path::generic_string(&local_e0,&local_108);
          std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
                    (&this->output_file,&local_e0);
          std::__cxx11::string::~string((string *)&local_e0);
          std::filesystem::__cxx11::path::~path(&local_108);
          std::filesystem::__cxx11::path::~path(&local_158);
          std::filesystem::__cxx11::path::~path
                    ((path *)&data.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                              field_0x10);
          std::filesystem::__cxx11::path::~path(&local_180);
          std::filesystem::__cxx11::path::~path(&local_130);
        }
      }
    }
  }
  if ((this->log & 1U) != 0) {
    poVar4 = std::operator<<((ostream *)&std::cerr,"Serializing...");
    std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
  }
  pvVar1 = (vector<char,_std::allocator<char>_> *)((long)&error.field_2 + 8);
  std::vector<char,_std::allocator<char>_>::vector(pvVar1);
  (**(code **)(*(long *)local_20 + 0x28))(&file,local_20,format,pvVar1);
  bVar2 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::empty
                    ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&file);
  if (bVar2) {
    __s = (FILE *)open_file<(char)119>(this,&this->output_file);
    if ((this->log & 1U) != 0) {
      poVar4 = std::operator<<((ostream *)&std::cerr,"Writing data...");
      std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
    }
    pvVar1 = (vector<char,_std::allocator<char>_> *)((long)&error.field_2 + 8);
    __ptr = std::vector<char,_std::allocator<char>_>::data(pvVar1);
    __n_00 = std::vector<char,_std::allocator<char>_>::size(pvVar1);
    fwrite(__ptr,1,__n_00,__s);
    fflush(__s);
    fclose(__s);
    std::__cxx11::string::~string((string *)&file);
    std::vector<char,_std::allocator<char>_>::~vector
              ((vector<char,_std::allocator<char>_> *)((long)&error.field_2 + 8));
    return extraout_RAX;
  }
  this_01 = (runtime_error *)__cxa_allocate_exception(0x10);
  std::runtime_error::runtime_error(this_01,(string *)&file);
  __cxa_throw(this_01,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

void write(Bin& bin) {
        auto format = get_format(output_format, "", output_file);
        if (!keep_hashed && !format->output_allways_hashed()) {
            unhash(bin);
        }
        if (output_file.empty()) {
            if (input_file == "-") {
                output_file = "-";
            } else {
                output_file = fs::path(input_file).replace_extension(format->default_extension()).generic_string();
                if (recursive && !output_dir.empty()) {
                    output_file = (output_dir / fs::relative(output_file, input_dir)).generic_string();
                }
            }
        }

        if (log) {
            std::cerr << "Serializing..." << std::endl;
        }
        std::vector<char> data;
        auto error = format->write(bin, data);
        if (!error.empty()) {
            throw std::runtime_error(error);
        }

        auto file = open_file<'w'>(output_file);
        if (log) {
            std::cerr << "Writing data..." << std::endl;
        }
        fwrite(data.data(), 1, data.size(), file);
        fflush(file);
        fclose(file);
    }